

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O1

void JPCommonLabel_make(JPCommonLabel *label)

{
  size_t __nmemb;
  int iVar1;
  uint uVar2;
  uint uVar3;
  JPCommonLabelBreathGroup *index;
  char **ppcVar4;
  char *pcVar5;
  undefined8 *__ptr;
  JPCommonLabelPhoneme *pJVar6;
  _JPCommonLabelWord *p_Var7;
  _JPCommonLabelWord **pp_Var8;
  _JPCommonLabelBreathGroup *p_Var9;
  _JPCommonLabelAccentPhrase **pp_Var10;
  int iVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  JPCommonLabelBreathGroup *index_2;
  undefined8 *puVar15;
  ulong uVar16;
  long lVar17;
  _JPCommonLabelAccentPhrase *p_Var18;
  _JPCommonLabelWord *p_Var19;
  _JPCommonLabelAccentPhrase *p_Var20;
  _JPCommonLabelMora *p_Var21;
  JPCommonLabelBreathGroup *pJVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  JPCommonLabelAccentPhrase *index_3;
  _JPCommonLabelMora *p_Var27;
  JPCommonLabelAccentPhrase *pJVar28;
  JPCommonLabelMora *pJVar29;
  _JPCommonLabelWord *p_Var30;
  _JPCommonLabelAccentPhrase *p_Var31;
  ulong uVar32;
  JPCommonLabelBreathGroup *index_1;
  _JPCommonLabelBreathGroup *p_Var33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  char buff [1024];
  
  pJVar6 = label->phoneme_head;
  label->size = 0;
  if (pJVar6 != (JPCommonLabelPhoneme *)0x0) {
    iVar11 = label->size;
    do {
      iVar11 = iVar11 + 1;
      pJVar6 = pJVar6->next;
    } while (pJVar6 != (_JPCommonLabelPhoneme *)0x0);
    label->size = iVar11;
  }
  uVar3 = label->size;
  if ((int)uVar3 < 1) {
    JPCommonLabel_make_cold_1();
    return;
  }
  __nmemb = (ulong)uVar3 + 2;
  label->size = (int)__nmemb;
  ppcVar4 = (char **)calloc(__nmemb,8);
  label->feature = ppcVar4;
  uVar26 = __nmemb & 0xffffffff;
  uVar35 = 0;
  do {
    pcVar5 = (char *)calloc(0x400,1);
    label->feature[uVar35] = pcVar5;
    uVar35 = uVar35 + 1;
  } while (uVar26 != uVar35);
  __ptr = (undefined8 *)calloc((ulong)(uVar3 + 6),8);
  *__ptr = "xx";
  __ptr[1] = "xx";
  __ptr[2] = "sil";
  __ptr[uVar26 + 1] = "sil";
  __ptr[uVar26 + 2] = "xx";
  __ptr[uVar26 + 3] = "xx";
  pJVar6 = label->phoneme_head;
  if (pJVar6 != (JPCommonLabelPhoneme *)0x0) {
    puVar15 = __ptr + 3;
    do {
      *puVar15 = pJVar6->phoneme;
      pJVar6 = pJVar6->next;
      puVar15 = puVar15 + 1;
    } while (pJVar6 != (_JPCommonLabelPhoneme *)0x0);
  }
  if (0 < label->size) {
    pJVar6 = label->phoneme_head;
    uVar35 = 0;
    do {
      iVar11 = strcmp(pJVar6->phoneme,"pau");
      sprintf(label->feature[uVar35],"%s^%s-%s+%s=%s",__ptr[uVar35],__ptr[uVar35 + 1],
              __ptr[uVar35 + 2],__ptr[uVar35 + 3],__ptr[uVar35 + 4]);
      if (((uVar35 == 0) || (iVar11 == 0)) || (uVar35 == label->size - 1)) {
        builtin_strncpy(buff,"/A:xx+xx+xx",0xb);
        buff._11_4_ = buff._11_4_ & 0xffffff00;
      }
      else {
        p_Var31 = ((_JPCommonLabelWord *)((_JPCommonLabelWord *)pJVar6->up)->tail)->up;
        p_Var19 = p_Var31->head;
        uVar3 = 0;
        p_Var7 = p_Var19;
        do {
          p_Var7 = (_JPCommonLabelWord *)p_Var7->head;
          if (p_Var7 == (_JPCommonLabelWord *)0x0) break;
          uVar3 = uVar3 + 1;
        } while (p_Var7 != (_JPCommonLabelWord *)pJVar6->up);
        iVar12 = p_Var31->accent;
        if (iVar12 == 0) {
          iVar12 = 0;
          p_Var7 = p_Var19;
          do {
            p_Var7 = (_JPCommonLabelWord *)p_Var7->head;
            if (p_Var7 == (_JPCommonLabelWord *)0x0) break;
            iVar12 = iVar12 + 1;
          } while (p_Var7 != (_JPCommonLabelWord *)p_Var31->tail->tail);
        }
        uVar23 = uVar3 - iVar12;
        if (0x30 < (int)uVar23) {
          uVar23 = 0x31;
        }
        uVar26 = (ulong)uVar23;
        if ((int)uVar23 < -0x30) {
          uVar26 = 0xffffffcf;
        }
        uVar23 = 0x31;
        if ((int)uVar3 < 0x31) {
          uVar23 = uVar3;
        }
        uVar16 = (ulong)uVar23;
        if ((int)uVar23 < 2) {
          uVar16 = 1;
        }
        do {
          p_Var19 = (_JPCommonLabelWord *)p_Var19->head;
          if (p_Var19 == (_JPCommonLabelWord *)0x0) break;
        } while (p_Var19 != (_JPCommonLabelWord *)p_Var31->tail->tail);
        sprintf(buff,"/A:%d+%d+%d",uVar26,uVar16);
      }
      strcat(label->feature[uVar35],buff);
      if (iVar11 == 0) {
        p_Var7 = pJVar6->prev->up->up;
      }
      else {
        p_Var19 = pJVar6->up->up;
        p_Var7 = p_Var19->prev;
        if (p_Var7 == (_JPCommonLabelWord *)0x0) {
          p_Var7 = (_JPCommonLabelWord *)0x0;
        }
        else if (uVar35 == label->size - 1) {
          p_Var7 = p_Var19;
        }
      }
      if (p_Var7 == (_JPCommonLabelWord *)0x0) {
        builtin_strncpy(buff,"/B:xx-xx_xx",0xb);
        buff._11_4_ = buff._11_4_ & 0xffffff00;
      }
      else {
        sprintf(buff,"/B:%s-%s_%s",p_Var7->pos,p_Var7->ctype);
      }
      strcat(label->feature[uVar35],buff);
      if (((uVar35 == 0) || (iVar11 == 0)) || (uVar35 == label->size - 1)) {
        builtin_strncpy(buff,"/C:xx_xx+xx",0xb);
        buff._11_4_ = buff._11_4_ & 0xffffff00;
      }
      else {
        p_Var7 = pJVar6->up->up;
        sprintf(buff,"/C:%s_%s+%s",p_Var7->pos,p_Var7->ctype);
      }
      strcat(label->feature[uVar35],buff);
      if (iVar11 == 0) {
        p_Var7 = pJVar6->next->up->up;
      }
      else {
        p_Var7 = pJVar6->up->up;
        p_Var19 = p_Var7->next;
        if (uVar35 != 0) {
          p_Var7 = p_Var19;
        }
        if (p_Var19 == (_JPCommonLabelWord *)0x0) {
          p_Var7 = p_Var19;
        }
      }
      if (p_Var7 == (_JPCommonLabelWord *)0x0) {
        builtin_strncpy(buff,"/D:xx+xx_xx",0xb);
        buff._11_4_ = buff._11_4_ & 0xffffff00;
      }
      else {
        sprintf(buff,"/D:%s+%s_%s",p_Var7->pos,p_Var7->ctype);
      }
      strcat(label->feature[uVar35],buff);
      if (iVar11 == 0) {
        pp_Var8 = &pJVar6->prev->up->up;
        lVar17 = 0x40;
LAB_0014d0c0:
        pp_Var8 = (_JPCommonLabelWord **)((long)&(*pp_Var8)->pron + lVar17);
      }
      else {
        pp_Var8 = (_JPCommonLabelWord **)&pJVar6->up->up->up;
        lVar17 = 0x20;
        if (uVar35 != label->size - 1) goto LAB_0014d0c0;
      }
      p_Var31 = (_JPCommonLabelAccentPhrase *)*pp_Var8;
      if (p_Var31 == (_JPCommonLabelAccentPhrase *)0x0) {
        builtin_strncpy(buff,"/E:xx_xx!xx_xx",0xf);
      }
      else {
        p_Var20 = p_Var31->head->head->up->up;
        p_Var7 = p_Var20->head;
        uVar3 = 0;
        p_Var19 = p_Var7;
        do {
          p_Var19 = (_JPCommonLabelWord *)p_Var19->head;
          if (p_Var19 == (_JPCommonLabelWord *)0x0) break;
          uVar3 = uVar3 + 1;
        } while (p_Var19 != (_JPCommonLabelWord *)p_Var20->tail->tail);
        if (0x30 < (int)uVar3) {
          uVar3 = 0x31;
        }
        if ((int)uVar3 < 2) {
          uVar3 = 1;
        }
        uVar23 = p_Var31->accent;
        if (uVar23 == 0) {
          uVar23 = 0;
          do {
            p_Var7 = (_JPCommonLabelWord *)p_Var7->head;
            if (p_Var7 == (_JPCommonLabelWord *)0x0) break;
            uVar23 = uVar23 + 1;
          } while (p_Var7 != (_JPCommonLabelWord *)p_Var20->tail->tail);
        }
        if (0x30 < (int)uVar23) {
          uVar23 = 0x31;
        }
        if ((int)uVar23 < 2) {
          uVar23 = 1;
        }
        sprintf(buff,"/E:%d_%d!%s_xx",(ulong)uVar3,(ulong)uVar23);
      }
      strcat(label->feature[uVar35],buff);
      if (((uVar35 == 0) || (p_Var31 == (_JPCommonLabelAccentPhrase *)0x0)) ||
         ((iVar11 == 0 || (uVar35 == label->size - 1)))) {
        builtin_strncpy(buff,"-xx",4);
      }
      else {
        iVar12 = strcmp(p_Var31->tail->tail->tail->next->phoneme,"pau");
        sprintf(buff,"-%d",(ulong)(iVar12 != 0));
      }
      strcat(label->feature[uVar35],buff);
      if ((uVar35 == 0) || (iVar11 == 0)) {
        p_Var31 = (_JPCommonLabelAccentPhrase *)0x0;
      }
      else {
        p_Var31 = (_JPCommonLabelAccentPhrase *)0x0;
        if (uVar35 != label->size - 1) {
          p_Var31 = pJVar6->up->up->up;
        }
      }
      if (p_Var31 == (_JPCommonLabelAccentPhrase *)0x0) {
        builtin_strncpy(buff + 0x13,"x|xx_xx",8);
        builtin_strncpy(buff,"/F:xx_xx#xx_xx@xx_x",0x13);
      }
      else {
        p_Var20 = p_Var31->up->head;
        uVar3 = 0;
        uVar23 = 0;
        if (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0) {
          p_Var18 = p_Var20;
          uVar24 = 1;
          do {
            uVar23 = uVar24;
            if (p_Var18 == p_Var31) break;
            p_Var18 = p_Var18->next;
            uVar24 = uVar23 + 1;
          } while (p_Var18 != (_JPCommonLabelAccentPhrase *)0x0);
        }
        p_Var7 = (_JPCommonLabelWord *)p_Var31->head->head;
        p_Var18 = ((_JPCommonLabelWord *)p_Var7->tail)->up;
        p_Var30 = p_Var18->up->head->head;
        p_Var19 = p_Var30;
        do {
          p_Var19 = (_JPCommonLabelWord *)p_Var19->head;
          if (p_Var19 == (_JPCommonLabelWord *)0x0) break;
          uVar3 = uVar3 + 1;
        } while (p_Var19 != p_Var7);
        p_Var7 = p_Var18->head;
        uVar24 = 0;
        p_Var19 = p_Var7;
        do {
          p_Var19 = (_JPCommonLabelWord *)p_Var19->head;
          if (p_Var19 == (_JPCommonLabelWord *)0x0) break;
          uVar24 = uVar24 + 1;
        } while (p_Var19 != (_JPCommonLabelWord *)p_Var18->tail->tail);
        if (0x30 < (int)uVar24) {
          uVar24 = 0x31;
        }
        if ((int)uVar24 < 2) {
          uVar24 = 1;
        }
        uVar13 = p_Var31->accent;
        if (uVar13 == 0) {
          uVar13 = 0;
          do {
            p_Var7 = (_JPCommonLabelWord *)p_Var7->head;
            if (p_Var7 == (_JPCommonLabelWord *)0x0) break;
            uVar13 = uVar13 + 1;
          } while (p_Var7 != (_JPCommonLabelWord *)p_Var18->tail->tail);
        }
        if (0x30 < (int)uVar13) {
          uVar13 = 0x31;
        }
        uVar26 = (ulong)uVar13;
        if ((int)uVar13 < 2) {
          uVar26 = 1;
        }
        pcVar5 = p_Var31->emotion;
        if (pcVar5 == (char *)0x0) {
          pcVar5 = "0";
        }
        uVar13 = 0x31;
        if ((int)uVar23 < 0x31) {
          uVar13 = uVar23;
        }
        if ((int)uVar13 < 2) {
          uVar13 = 1;
        }
        iVar12 = 0;
        iVar36 = 0;
        if (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0) {
          iVar1 = 1;
          do {
            iVar36 = iVar1;
            if (p_Var20 == p_Var31->up->tail) break;
            p_Var20 = p_Var20->next;
            iVar1 = iVar36 + 1;
          } while (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0);
        }
        iVar36 = iVar36 - uVar23;
        if (0x2f < iVar36) {
          iVar36 = 0x30;
        }
        if (iVar36 < 1) {
          iVar36 = 0;
        }
        uVar23 = 99;
        if ((int)uVar3 < 99) {
          uVar23 = uVar3;
        }
        uVar16 = (ulong)uVar23;
        if ((int)uVar23 < 2) {
          uVar16 = 1;
        }
        do {
          p_Var30 = (_JPCommonLabelWord *)p_Var30->head;
          if (p_Var30 == (_JPCommonLabelWord *)0x0) break;
          iVar12 = iVar12 + 1;
        } while (p_Var30 != (_JPCommonLabelWord *)p_Var18->up->tail->tail->tail);
        iVar12 = iVar12 - uVar3;
        if (0x61 < iVar12) {
          iVar12 = 0x62;
        }
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        sprintf(buff,"/F:%d_%d#%s_xx@%d_%d|%d_%d",(ulong)uVar24,uVar26,pcVar5,(ulong)uVar13,
                (ulong)(iVar36 + 1),uVar16,(ulong)(iVar12 + 1));
      }
      strcat(label->feature[uVar35],buff);
      if (iVar11 == 0) {
        pp_Var8 = &pJVar6->next->up->up;
        lVar17 = 0x40;
LAB_0014d44a:
        pp_Var8 = (_JPCommonLabelWord **)((long)&(*pp_Var8)->pron + lVar17);
      }
      else {
        pp_Var8 = (_JPCommonLabelWord **)&pJVar6->up->up->up;
        lVar17 = 0x28;
        if (uVar35 != 0) goto LAB_0014d44a;
      }
      p_Var31 = (_JPCommonLabelAccentPhrase *)*pp_Var8;
      if (p_Var31 == (_JPCommonLabelAccentPhrase *)0x0) {
        sprintf(buff,"/G:xx_xx%%xx_xx");
      }
      else {
        p_Var20 = p_Var31->head->head->up->up;
        p_Var7 = p_Var20->head;
        uVar3 = 0;
        p_Var19 = p_Var7;
        do {
          p_Var19 = (_JPCommonLabelWord *)p_Var19->head;
          if (p_Var19 == (_JPCommonLabelWord *)0x0) break;
          uVar3 = uVar3 + 1;
        } while (p_Var19 != (_JPCommonLabelWord *)p_Var20->tail->tail);
        if (0x30 < (int)uVar3) {
          uVar3 = 0x31;
        }
        if ((int)uVar3 < 2) {
          uVar3 = 1;
        }
        uVar23 = p_Var31->accent;
        if (uVar23 == 0) {
          uVar23 = 0;
          do {
            p_Var7 = (_JPCommonLabelWord *)p_Var7->head;
            if (p_Var7 == (_JPCommonLabelWord *)0x0) break;
            uVar23 = uVar23 + 1;
          } while (p_Var7 != (_JPCommonLabelWord *)p_Var20->tail->tail);
        }
        if (0x30 < (int)uVar23) {
          uVar23 = 0x31;
        }
        if ((int)uVar23 < 2) {
          uVar23 = 1;
        }
        sprintf(buff,"/G:%d_%d%%%s_xx",(ulong)uVar3,(ulong)uVar23);
      }
      strcat(label->feature[uVar35],buff);
      if ((((uVar35 == 0) || (p_Var31 == (_JPCommonLabelAccentPhrase *)0x0)) || (iVar11 == 0)) ||
         (uVar35 == label->size - 1)) {
        builtin_strncpy(buff,"_xx",4);
      }
      else {
        iVar12 = strcmp(p_Var31->head->head->head->prev->phoneme,"pau");
        sprintf(buff,"_%d",(ulong)(iVar12 != 0));
      }
      strcat(label->feature[uVar35],buff);
      if (iVar11 == 0) {
        pp_Var10 = &pJVar6->prev->up->up->up;
        lVar17 = 0x30;
LAB_0014d5c4:
        pp_Var10 = (_JPCommonLabelAccentPhrase **)((long)&(*pp_Var10)->accent + lVar17);
      }
      else {
        pp_Var10 = (_JPCommonLabelAccentPhrase **)&pJVar6->up->up->up->up;
        lVar17 = 0x10;
        if (uVar35 != label->size - 1) goto LAB_0014d5c4;
      }
      if ((_JPCommonLabelBreathGroup *)*pp_Var10 == (_JPCommonLabelBreathGroup *)0x0) {
        builtin_strncpy(buff,"/H:xx_xx",9);
      }
      else {
        p_Var31 = ((_JPCommonLabelBreathGroup *)*pp_Var10)->head;
        p_Var33 = p_Var31->up;
        p_Var20 = p_Var33->head;
        uVar3 = 0;
        uVar23 = 0;
        if (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0) {
          uVar24 = 1;
          do {
            uVar23 = uVar24;
            if (p_Var20 == p_Var33->tail) break;
            p_Var20 = p_Var20->next;
            uVar24 = uVar23 + 1;
          } while (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0);
        }
        if (0x30 < (int)uVar23) {
          uVar23 = 0x31;
        }
        uVar26 = (ulong)uVar23;
        if ((int)uVar23 < 2) {
          uVar26 = 1;
        }
        p_Var33 = p_Var31->head->head->up->up->up;
        p_Var7 = p_Var33->head->head;
        do {
          p_Var7 = (_JPCommonLabelWord *)p_Var7->head;
          if (p_Var7 == (_JPCommonLabelWord *)0x0) break;
          uVar3 = uVar3 + 1;
        } while (p_Var7 != (_JPCommonLabelWord *)p_Var33->tail->tail->tail);
        if (0x62 < (int)uVar3) {
          uVar3 = 99;
        }
        if ((int)uVar3 < 2) {
          uVar3 = 1;
        }
        sprintf(buff,"/H:%d_%d",uVar26,(ulong)uVar3);
      }
      strcat(label->feature[uVar35],buff);
      if ((uVar35 == 0) || (iVar11 == 0)) {
        p_Var33 = (_JPCommonLabelBreathGroup *)0x0;
      }
      else {
        p_Var33 = (_JPCommonLabelBreathGroup *)0x0;
        if (uVar35 != label->size - 1) {
          p_Var33 = pJVar6->up->up->up->up;
        }
      }
      if (p_Var33 == (_JPCommonLabelBreathGroup *)0x0) {
        builtin_strncpy(buff + 0x13,"x|xx+xx",8);
        builtin_strncpy(buff,"/I:xx-xx@xx+xx&xx-x",0x13);
      }
      else {
        p_Var9 = p_Var33;
        uVar3 = 0;
        do {
          uVar23 = uVar3;
          uVar3 = uVar23 + 1;
          p_Var9 = p_Var9->prev;
        } while (p_Var9 != (_JPCommonLabelBreathGroup *)0x0);
        p_Var31 = p_Var33->head;
        uVar24 = 0;
        uVar13 = 0;
        if (p_Var31 != (_JPCommonLabelAccentPhrase *)0x0) {
          uVar13 = 0;
          p_Var20 = p_Var31;
          do {
            uVar13 = uVar13 + 1;
            p_Var20 = p_Var20->prev;
          } while (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0);
        }
        p_Var27 = p_Var31->head->head;
        if (p_Var27 != (_JPCommonLabelMora *)0x0) {
          uVar24 = 0;
          p_Var21 = p_Var27;
          do {
            uVar24 = uVar24 + 1;
            p_Var21 = p_Var21->prev;
          } while (p_Var21 != (_JPCommonLabelMora *)0x0);
        }
        p_Var20 = p_Var31->up->head;
        uVar14 = 0;
        uVar25 = 0;
        if (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0) {
          uVar2 = 1;
          do {
            uVar25 = uVar2;
            if (p_Var20 == p_Var31->up->tail) break;
            p_Var20 = p_Var20->next;
            uVar2 = uVar25 + 1;
          } while (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0);
        }
        if (0x30 < (int)uVar25) {
          uVar25 = 0x31;
        }
        uVar26 = (ulong)uVar25;
        if ((int)uVar25 < 2) {
          uVar26 = 1;
        }
        p_Var9 = p_Var27->up->up->up;
        p_Var7 = p_Var9->head->head;
        do {
          p_Var7 = (_JPCommonLabelWord *)p_Var7->head;
          if (p_Var7 == (_JPCommonLabelWord *)0x0) break;
          uVar14 = uVar14 + 1;
        } while (p_Var7 != (_JPCommonLabelWord *)p_Var9->tail->tail->tail);
        if (0x62 < (int)uVar14) {
          uVar14 = 99;
        }
        uVar16 = (ulong)uVar14;
        if ((int)uVar14 < 2) {
          uVar16 = 1;
        }
        p_Var9 = p_Var33;
        uVar23 = ~uVar23;
        do {
          uVar14 = uVar23;
          p_Var9 = p_Var9->next;
          uVar23 = uVar14 + 1;
        } while (p_Var9 != (_JPCommonLabelBreathGroup *)0x0);
        do {
          p_Var33 = p_Var33->prev;
          uVar14 = uVar14 + 1;
        } while (p_Var33 != (_JPCommonLabelBreathGroup *)0x0);
        if (0x11 < (int)uVar14) {
          uVar14 = 0x12;
        }
        if ((int)uVar14 < 1) {
          uVar14 = 0;
        }
        uVar23 = 0x31;
        if ((int)uVar13 < 0x31) {
          uVar23 = uVar13;
        }
        uVar13 = ~uVar13;
        p_Var20 = p_Var31;
        do {
          p_Var20 = p_Var20->next;
          uVar13 = uVar13 + 1;
        } while (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0);
        uVar32 = (ulong)uVar3;
        if (0x12 < (int)uVar3) {
          uVar32 = 0x13;
        }
        uVar34 = (ulong)uVar23;
        if ((int)uVar23 < 2) {
          uVar34 = 1;
        }
        iVar12 = 0;
        for (; p_Var31 != (_JPCommonLabelAccentPhrase *)0x0; p_Var31 = p_Var31->prev) {
          iVar12 = iVar12 + 1;
        }
        iVar12 = iVar12 + uVar13;
        if (0x2f < iVar12) {
          iVar12 = 0x30;
        }
        if (iVar12 < 1) {
          iVar12 = 0;
        }
        uVar3 = 199;
        if ((int)uVar24 < 199) {
          uVar3 = uVar24;
        }
        uVar24 = ~uVar24;
        p_Var21 = p_Var27;
        do {
          p_Var21 = p_Var21->next;
          uVar24 = uVar24 + 1;
        } while (p_Var21 != (_JPCommonLabelMora *)0x0);
        if ((int)uVar3 < 2) {
          uVar3 = 1;
        }
        iVar36 = 0;
        for (; p_Var27 != (_JPCommonLabelMora *)0x0; p_Var27 = p_Var27->prev) {
          iVar36 = iVar36 + 1;
        }
        iVar36 = iVar36 + uVar24;
        if (0xc5 < iVar36) {
          iVar36 = 0xc6;
        }
        if (iVar36 < 1) {
          iVar36 = 0;
        }
        sprintf(buff,"/I:%d-%d@%d+%d&%d-%d|%d+%d",uVar26,uVar16,uVar32,(ulong)(uVar14 + 1),uVar34,
                (ulong)(iVar12 + 1),(ulong)uVar3,(ulong)(iVar36 + 1));
      }
      strcat(label->feature[uVar35],buff);
      if (iVar11 == 0) {
        pp_Var10 = &pJVar6->next->up->up->up;
        lVar17 = 0x30;
LAB_0014d952:
        pp_Var10 = (_JPCommonLabelAccentPhrase **)((long)&(*pp_Var10)->accent + lVar17);
      }
      else {
        pp_Var10 = (_JPCommonLabelAccentPhrase **)&pJVar6->up->up->up->up;
        lVar17 = 0x18;
        if (uVar35 != 0) goto LAB_0014d952;
      }
      if ((_JPCommonLabelBreathGroup *)*pp_Var10 == (_JPCommonLabelBreathGroup *)0x0) {
        builtin_strncpy(buff,"/J:xx_xx",9);
      }
      else {
        p_Var31 = ((_JPCommonLabelBreathGroup *)*pp_Var10)->head;
        p_Var33 = p_Var31->up;
        p_Var20 = p_Var33->head;
        uVar3 = 0;
        uVar23 = 0;
        if (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0) {
          uVar24 = 1;
          do {
            uVar23 = uVar24;
            if (p_Var20 == p_Var33->tail) break;
            p_Var20 = p_Var20->next;
            uVar24 = uVar23 + 1;
          } while (p_Var20 != (_JPCommonLabelAccentPhrase *)0x0);
        }
        if (0x30 < (int)uVar23) {
          uVar23 = 0x31;
        }
        uVar26 = (ulong)uVar23;
        if ((int)uVar23 < 2) {
          uVar26 = 1;
        }
        p_Var33 = p_Var31->head->head->up->up->up;
        p_Var7 = p_Var33->head->head;
        do {
          p_Var7 = (_JPCommonLabelWord *)p_Var7->head;
          if (p_Var7 == (_JPCommonLabelWord *)0x0) break;
          uVar3 = uVar3 + 1;
        } while (p_Var7 != (_JPCommonLabelWord *)p_Var33->tail->tail->tail);
        if (0x62 < (int)uVar3) {
          uVar3 = 99;
        }
        if ((int)uVar3 < 2) {
          uVar3 = 1;
        }
        sprintf(buff,"/J:%d_%d",uVar26,(ulong)uVar3);
      }
      uVar26 = uVar35 + 1;
      strcat(label->feature[uVar35],buff);
      pJVar22 = label->breath_head;
      iVar11 = -1;
      p_Var33 = pJVar22;
      do {
        p_Var33 = p_Var33->next;
        iVar11 = iVar11 + 1;
      } while (p_Var33 != (_JPCommonLabelBreathGroup *)0x0);
      iVar12 = 0;
      for (; pJVar22 != (JPCommonLabelBreathGroup *)0x0; pJVar22 = pJVar22->prev) {
        iVar12 = iVar12 + 1;
      }
      uVar3 = iVar12 + iVar11;
      if (0x12 < iVar12 + iVar11) {
        uVar3 = 0x13;
      }
      pJVar28 = label->accent_head;
      iVar11 = -1;
      p_Var31 = pJVar28;
      do {
        p_Var31 = p_Var31->next;
        iVar11 = iVar11 + 1;
      } while (p_Var31 != (_JPCommonLabelAccentPhrase *)0x0);
      if ((int)uVar3 < 2) {
        uVar3 = 1;
      }
      iVar12 = 0;
      for (; pJVar28 != (JPCommonLabelAccentPhrase *)0x0; pJVar28 = pJVar28->prev) {
        iVar12 = iVar12 + 1;
      }
      uVar23 = iVar12 + iVar11;
      if (0x30 < iVar12 + iVar11) {
        uVar23 = 0x31;
      }
      pJVar29 = label->mora_head;
      iVar11 = -1;
      p_Var27 = pJVar29;
      do {
        p_Var27 = p_Var27->next;
        iVar11 = iVar11 + 1;
      } while (p_Var27 != (_JPCommonLabelMora *)0x0);
      uVar16 = (ulong)uVar23;
      if ((int)uVar23 < 2) {
        uVar16 = 1;
      }
      iVar12 = 0;
      for (; pJVar29 != (JPCommonLabelMora *)0x0; pJVar29 = pJVar29->prev) {
        iVar12 = iVar12 + 1;
      }
      uVar23 = iVar12 + iVar11;
      if (0xc6 < (int)uVar23) {
        uVar23 = 199;
      }
      if ((int)uVar23 < 2) {
        uVar23 = 1;
      }
      sprintf(buff,"/K:%d+%d-%d",(ulong)uVar3,uVar16,(ulong)uVar23);
      strcat(label->feature[uVar35],buff);
      if ((uVar35 != 0) && ((long)uVar35 < (long)label->size + -2)) {
        pJVar6 = pJVar6->next;
      }
      uVar35 = uVar26;
    } while ((long)uVar26 < (long)label->size);
  }
  free(__ptr);
  return;
}

Assistant:

void JPCommonLabel_make(JPCommonLabel * label)
{
   int i, tmp1, tmp2, tmp3;
   char buff[MAXBUFLEN];
   JPCommonLabelPhoneme *p;
   JPCommonLabelWord *w;
   JPCommonLabelAccentPhrase *a;
   JPCommonLabelBreathGroup *b;
   char **phoneme_list;
   int short_pause_flag;

   /* initialize */
   for (p = label->phoneme_head, label->size = 0; p != NULL; p = p->next)
      label->size++;
   if (label->size < 1) {
      fprintf(stderr, "WARNING: JPCommonLabel_make() in jcomon_label.c: No phoneme.\n");
      return;
   }
   label->size += 2;
   label->feature = (char **) calloc(label->size, sizeof(char *));
   for (i = 0; i < label->size; i++)
      label->feature[i] = (char *) calloc(MAXBUFLEN, sizeof(char));

   /* phoneme list */
   phoneme_list = (char **) calloc(label->size + 4, sizeof(char *));
   phoneme_list[0] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[1] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[2] = JPCOMMON_PHONEME_SILENT;
   phoneme_list[label->size + 1] = JPCOMMON_PHONEME_SILENT;
   phoneme_list[label->size + 2] = JPCOMMON_PHONEME_UNKNOWN;
   phoneme_list[label->size + 3] = JPCOMMON_PHONEME_UNKNOWN;
   for (i = 3, p = label->phoneme_head; p != NULL; p = p->next)
      phoneme_list[i++] = p->phoneme;

   for (i = 0, p = label->phoneme_head; i < label->size; i++) {
      if (strcmp(p->phoneme, JPCOMMON_PHONEME_SHORT_PAUSE) == 0)
         short_pause_flag = 1;
      else
         short_pause_flag = 0;

      /* for phoneme */
      sprintf(label->feature[i], "%s^%s-%s+%s=%s", phoneme_list[i], phoneme_list[i + 1],
              phoneme_list[i + 2], phoneme_list[i + 3], phoneme_list[i + 4]);
      /* for A: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         sprintf(buff, "/A:xx+xx+xx");
      else {
         tmp1 = index_mora_in_accent_phrase(p->up);
         tmp2 =
             p->up->up->up->accent ==
             0 ? count_mora_in_accent_phrase(p->up) : p->up->up->up->accent;
         sprintf(buff, "/A:%d+%d+%d", limit(tmp1 - tmp2, -MAX_M, MAX_M), limit(tmp1, 1, MAX_M),
                 limit(count_mora_in_accent_phrase(p->up) - tmp1 + 1, 1, MAX_M));
      }
      strcat(label->feature[i], buff);
      /* for B: */
      if (short_pause_flag == 1)
         w = p->prev->up->up;
      else if (p->up->up->prev == NULL)
         w = NULL;
      else if (i == label->size - 1)
         w = p->up->up;
      else
         w = p->up->up->prev;
      if (w == NULL)
         sprintf(buff, "/B:xx-xx_xx");
      else
         sprintf(buff, "/B:%s-%s_%s", w->pos, w->ctype, w->cform);
      strcat(label->feature[i], buff);
      /* for C: */
      if (i == 0 || i == label->size - 1 || short_pause_flag)
         sprintf(buff, "/C:xx_xx+xx");
      else
         sprintf(buff, "/C:%s_%s+%s", p->up->up->pos, p->up->up->ctype, p->up->up->cform);
      strcat(label->feature[i], buff);
      /* for D: */
      if (short_pause_flag == 1)
         w = p->next->up->up;
      else if (p->up->up->next == NULL)
         w = NULL;
      else if (i == 0)
         w = p->up->up;
      else
         w = p->up->up->next;
      if (w == NULL)
         sprintf(buff, "/D:xx+xx_xx");
      else
         sprintf(buff, "/D:%s+%s_%s", w->pos, w->ctype, w->cform);
      strcat(label->feature[i], buff);
      /* for E: */
      if (short_pause_flag == 1)
         a = p->prev->up->up->up;
      else if (i == label->size - 1)
         a = p->up->up->up;
      else
         a = p->up->up->up->prev;
      if (a == NULL)
         sprintf(buff, "/E:xx_xx!xx_xx");
      else
         sprintf(buff, "/E:%d_%d!%s_xx",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion);
      strcat(label->feature[i], buff);
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1 || a == NULL)
         sprintf(buff, "-xx");
      else
         sprintf(buff, "-%d",
                 strcmp(a->tail->tail->tail->next->phoneme,
                        JPCOMMON_PHONEME_SHORT_PAUSE) == 0 ? 0 : 1);
      strcat(label->feature[i], buff);
      /* for F: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         a = NULL;
      else
         a = p->up->up->up;
      if (a == NULL)
         sprintf(buff, "/F:xx_xx#xx_xx@xx_xx|xx_xx");
      else {
         tmp1 = index_accent_phrase_in_breath_group(a);
         tmp2 = index_mora_in_breath_group(a->head->head);
         sprintf(buff, "/F:%d_%d#%s_xx@%d_%d|%d_%d",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion, limit(tmp1, 1, MAX_M),
                 limit(count_accent_phrase_in_breath_group(a) - tmp1 + 1, 1, MAX_M), limit(tmp2, 1,
                                                                                           MAX_L),
                 limit(count_mora_in_breath_group(a->head->head) - tmp2 + 1, 1, MAX_L));
      }
      strcat(label->feature[i], buff);
      /* for G: */
      if (short_pause_flag == 1)
         a = p->next->up->up->up;
      else if (i == 0)
         a = p->up->up->up;
      else
         a = p->up->up->up->next;
      if (a == NULL)
         sprintf(buff, "/G:xx_xx%%xx_xx");
      else
         sprintf(buff, "/G:%d_%d%%%s_xx",
                 limit(count_mora_in_accent_phrase(a->head->head), 1, MAX_M),
                 limit(a->accent == 0 ? count_mora_in_accent_phrase(a->head->head) : a->accent, 1,
                       MAX_M), a->emotion == NULL ? "0" : a->emotion);
      strcat(label->feature[i], buff);
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1 || a == NULL)
         sprintf(buff, "_xx");
      else
         sprintf(buff, "_%d",
                 strcmp(a->head->head->head->prev->phoneme,
                        JPCOMMON_PHONEME_SHORT_PAUSE) == 0 ? 0 : 1);
      strcat(label->feature[i], buff);
      /* for H: */
      if (short_pause_flag == 1)
         b = p->prev->up->up->up->up;
      else if (i == label->size - 1)
         b = p->up->up->up->up;
      else
         b = p->up->up->up->up->prev;
      if (b == NULL)
         sprintf(buff, "/H:xx_xx");
      else
         sprintf(buff, "/H:%d_%d", limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L));
      strcat(label->feature[i], buff);
      /* for I: */
      if (i == 0 || i == label->size - 1 || short_pause_flag == 1)
         b = NULL;
      else
         b = p->up->up->up->up;
      if (b == NULL)
         sprintf(buff, "/I:xx-xx@xx+xx&xx-xx|xx+xx");
      else {
         tmp1 = index_breath_group_in_utterance(b);
         tmp2 = index_accent_phrase_in_utterance(b->head);
         tmp3 = index_mora_in_utterance(b->head->head->head);
         sprintf(buff, "/I:%d-%d@%d+%d&%d-%d|%d+%d",
                 limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L), limit(tmp1, 1,
                                                                                         MAX_S),
                 limit(count_breath_group_in_utterance(b) - tmp1 + 1, 1, MAX_S), limit(tmp2, 1,
                                                                                       MAX_M),
                 limit(count_accent_phrase_in_utterance(b->head) - tmp2 + 1, 1, MAX_M), limit(tmp3,
                                                                                              1,
                                                                                              MAX_LL),
                 limit(count_mora_in_utterance(b->head->head->head) - tmp3 + 1, 1, MAX_LL));
      }
      strcat(label->feature[i], buff);
      /* for J: */
      if (short_pause_flag == 1)
         b = p->next->up->up->up->up;
      else if (i == 0)
         b = p->up->up->up->up;
      else
         b = p->up->up->up->up->next;
      if (b == NULL)
         sprintf(buff, "/J:xx_xx");
      else
         sprintf(buff, "/J:%d_%d", limit(count_accent_phrase_in_breath_group(b->head), 1, MAX_M),
                 limit(count_mora_in_breath_group(b->head->head->head), 1, MAX_L));
      strcat(label->feature[i], buff);
      /* for K: */
      sprintf(buff, "/K:%d+%d-%d",
              limit(count_breath_group_in_utterance(label->breath_head), 1, MAX_S),
              limit(count_accent_phrase_in_utterance(label->accent_head), 1, MAX_M),
              limit(count_mora_in_utterance(label->mora_head), 1, MAX_LL));
      strcat(label->feature[i], buff);

      if (0 < i && i < label->size - 2)
         p = p->next;
   }

   /* free */
   free(phoneme_list);
}